

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int prvTidyDocParseStream(TidyDocImpl *doc,StreamIn *in)

{
  ulong uVar1;
  TidyConfigChangeCallback p_Var2;
  int iVar3;
  Bool BVar4;
  Lexer *pLVar5;
  int bomEnc;
  TidyConfigChangeCallback callback;
  Bool xmlIn;
  StreamIn *in_local;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x67].v;
  p_Var2 = doc->pConfigChangeCallback;
  doc->pConfigChangeCallback = (TidyConfigChangeCallback)0x0;
  if ((doc != (TidyDocImpl *)0x0) && (in != (StreamIn *)0x0)) {
    if (doc->docIn != (StreamIn *)0x0) {
      __assert_fail("doc->docIn == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/tidylib.c"
                    ,0x5b8,"int prvTidyDocParseStream(TidyDocImpl *, StreamIn *)");
    }
    doc->docIn = in;
    prvTidyResetTags(doc);
    prvTidyTakeConfigSnapshot(doc);
    prvTidyAdjustConfig(doc);
    prvTidyFreeAnchors(doc);
    prvTidyFreeNode(doc,&doc->root);
    memset(doc,0,0x70);
    if (doc->givenDoctype != (tmbstr)0x0) {
      (*doc->allocator->vtbl->free)(doc->allocator,doc->givenDoctype);
    }
    prvTidyFreeLexer(doc);
    doc->givenDoctype = (tmbstr)0x0;
    pLVar5 = prvTidyNewLexer(doc);
    doc->lexer = pLVar5;
    (doc->root).line = doc->lexer->lines;
    (doc->root).column = doc->lexer->columns;
    doc->inputHadBOM = no;
    doc->xmlDetected = no;
    iVar3 = prvTidyReadBOMEncoding(in);
    if (iVar3 != -1) {
      in->encoding = iVar3;
      prvTidySetOptionInt(doc,TidyInCharEncoding,(long)iVar3);
    }
    if ((int)uVar1 == 0) {
      doc->warnings = 0;
      prvTidyParseDocument(doc);
      BVar4 = prvTidyCheckNodeIntegrity(&doc->root);
      if (BVar4 == no) {
        (*doc->allocator->vtbl->panic)(doc->allocator,integrity);
      }
    }
    else {
      prvTidyParseXMLDocument(doc);
      BVar4 = prvTidyCheckNodeIntegrity(&doc->root);
      if (BVar4 == no) {
        (*doc->allocator->vtbl->panic)(doc->allocator,integrity);
      }
    }
    doc->docIn = (StreamIn *)0x0;
    doc->pConfigChangeCallback = p_Var2;
    iVar3 = tidyDocStatus(doc);
    return iVar3;
  }
  __assert_fail("doc != NULL && in != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/tidylib.c"
                ,0x5b7,"int prvTidyDocParseStream(TidyDocImpl *, StreamIn *)");
}

Assistant:

int         TY_(DocParseStream)( TidyDocImpl* doc, StreamIn* in )
{
    Bool xmlIn = cfgBool( doc, TidyXmlTags );
    TidyConfigChangeCallback callback = doc->pConfigChangeCallback;
    
    int bomEnc;
    doc->pConfigChangeCallback = NULL;

    assert( doc != NULL && in != NULL );
    assert( doc->docIn == NULL );
    doc->docIn = in;

    TY_(ResetTags)(doc);             /* Reset table to html5 mode */
    TY_(TakeConfigSnapshot)( doc );  /* Save config state */
    TY_(AdjustConfig)( doc );        /* Ensure config internal consistency */
    TY_(FreeAnchors)( doc );

    TY_(FreeNode)(doc, &doc->root);
    TidyClearMemory(&doc->root, sizeof(Node));

    if (doc->givenDoctype)
        TidyDocFree(doc, doc->givenDoctype);
    /*\ 
     *  Issue #186 - Now FreeNode depend on the doctype, so the lexer is needed
     *  to determine which hash is to be used, so free it last.
    \*/
    TY_(FreeLexer)( doc );
    doc->givenDoctype = NULL;

    doc->lexer = TY_(NewLexer)( doc );
    /* doc->lexer->root = &doc->root; */
    doc->root.line = doc->lexer->lines;
    doc->root.column = doc->lexer->columns;
    doc->inputHadBOM = no;
    doc->xmlDetected = no;

    bomEnc = TY_(ReadBOMEncoding)(in);

    if (bomEnc != -1)
    {
        in->encoding = bomEnc;
        TY_(SetOptionInt)(doc, TidyInCharEncoding, bomEnc);
    }

    /* Tidy doesn't alter the doctype for generic XML docs */
    if ( xmlIn )
    {
        TY_(ParseXMLDocument)( doc );
        if ( !TY_(CheckNodeIntegrity)( &doc->root ) )
            TidyPanic( doc->allocator, integrity );
    }
    else
    {
        doc->warnings = 0;
        TY_(ParseDocument)( doc );
        if ( !TY_(CheckNodeIntegrity)( &doc->root ) )
            TidyPanic( doc->allocator, integrity );
    }

    doc->docIn = NULL;
    doc->pConfigChangeCallback = callback;

    return tidyDocStatus( doc );
}